

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O2

string * __thiscall
Test::Output::truncateString(string *__return_storage_ptr__,Output *this,string *string,uint length)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((ulong)length < string->_M_string_length) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_30,string,0,(ulong)(length - 3));
    std::operator+(__return_storage_ptr__,&local_30,"...");
    std::__cxx11::string::~string(&local_30);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,string);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Output::truncateString(const std::string &string, unsigned int length) const {
  if (string.size() <= length) {
    return string;
  }
  return string.substr(0, length - 3) + "...";
}